

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_tester.cc
# Opt level: O0

void __thiscall
google::protobuf::MapReflectionTester::MutableUnknownFieldsOfMapFieldsViaReflection
          (MapReflectionTester *this,Message *message)

{
  bool bVar1;
  Reflection *pRVar2;
  FieldDescriptor *pFVar3;
  Message *pMVar4;
  Reflection *pRVar5;
  UnknownFieldSet *pUVar6;
  char *pcVar7;
  char *in_R9;
  string local_610;
  AssertHelper local_5f0;
  Message local_5e8;
  bool local_5d9;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar__16;
  string local_5b8;
  AssertHelper local_598;
  Message local_590;
  bool local_581;
  undefined1 local_580 [8];
  AssertionResult gtest_ar__15;
  string local_560;
  AssertHelper local_540;
  Message local_538;
  bool local_529;
  undefined1 local_528 [8];
  AssertionResult gtest_ar__14;
  string local_508;
  AssertHelper local_4e8;
  Message local_4e0;
  bool local_4d1;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar__13;
  string local_4b0;
  AssertHelper local_490;
  Message local_488;
  bool local_479;
  undefined1 local_478 [8];
  AssertionResult gtest_ar__12;
  string local_458;
  AssertHelper local_438;
  Message local_430;
  bool local_421;
  undefined1 local_420 [8];
  AssertionResult gtest_ar__11;
  string local_400;
  AssertHelper local_3e0;
  Message local_3d8;
  bool local_3c9;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar__10;
  string local_3a8;
  AssertHelper local_388;
  Message local_380;
  bool local_371;
  undefined1 local_370 [8];
  AssertionResult gtest_ar__9;
  string local_350;
  AssertHelper local_330;
  Message local_328;
  bool local_319;
  undefined1 local_318 [8];
  AssertionResult gtest_ar__8;
  string local_2f8;
  AssertHelper local_2d8;
  Message local_2d0;
  bool local_2c1;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar__7;
  string local_2a0;
  AssertHelper local_280;
  Message local_278;
  bool local_269;
  undefined1 local_268 [8];
  AssertionResult gtest_ar__6;
  string local_248;
  AssertHelper local_228;
  Message local_220;
  bool local_211;
  undefined1 local_210 [8];
  AssertionResult gtest_ar__5;
  string local_1f0;
  AssertHelper local_1d0;
  Message local_1c8;
  bool local_1b9;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar__4;
  string local_198;
  AssertHelper local_178;
  Message local_170;
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__3;
  string local_140;
  AssertHelper local_120;
  Message local_118;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar__2;
  string local_e8;
  AssertHelper local_c8;
  Message local_c0;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar__1;
  string local_90;
  AssertHelper local_70;
  Message local_68 [3];
  bool local_49;
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  Message *sub_message;
  Reflection *reflection;
  Message *message_local;
  MapReflectionTester *this_local;
  
  pRVar2 = Message::GetReflection(message);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,
             "map_int32_int32");
  pFVar3 = F(this,stack0xffffffffffffffc8);
  pMVar4 = Reflection::AddMessage(pRVar2,message,pFVar3,(MessageFactory *)0x0);
  pRVar5 = Message::GetReflection(pMVar4);
  pUVar6 = Reflection::MutableUnknownFields(pRVar5,pMVar4);
  local_49 = pUVar6 != (UnknownFieldSet *)0x0;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_48,&local_49,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)local_48,
               (AssertionResult *)
               "sub_message->GetReflection()->MutableUnknownFields(sub_message) != nullptr","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x32a,pcVar7);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__1.message_,
             "map_int64_int64");
  pFVar3 = F(this,stack0xffffffffffffff60);
  pMVar4 = Reflection::AddMessage(pRVar2,message,pFVar3,(MessageFactory *)0x0);
  pRVar5 = Message::GetReflection(pMVar4);
  pUVar6 = Reflection::MutableUnknownFields(pRVar5,pMVar4);
  local_b1 = pUVar6 != (UnknownFieldSet *)0x0;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,(internal *)local_b0,
               (AssertionResult *)
               "sub_message->GetReflection()->MutableUnknownFields(sub_message) != nullptr","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x32d,pcVar7);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__2.message_,
             "map_uint32_uint32");
  pFVar3 = F(this,stack0xffffffffffffff08);
  pMVar4 = Reflection::AddMessage(pRVar2,message,pFVar3,(MessageFactory *)0x0);
  pRVar5 = Message::GetReflection(pMVar4);
  pUVar6 = Reflection::MutableUnknownFields(pRVar5,pMVar4);
  local_109 = pUVar6 != (UnknownFieldSet *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_140,(internal *)local_108,
               (AssertionResult *)
               "sub_message->GetReflection()->MutableUnknownFields(sub_message) != nullptr","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x330,pcVar7);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__3.message_,
             "map_uint64_uint64");
  pFVar3 = F(this,stack0xfffffffffffffeb0);
  pMVar4 = Reflection::AddMessage(pRVar2,message,pFVar3,(MessageFactory *)0x0);
  pRVar5 = Message::GetReflection(pMVar4);
  pUVar6 = Reflection::MutableUnknownFields(pRVar5,pMVar4);
  local_161 = pUVar6 != (UnknownFieldSet *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_160,&local_161,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)local_160,
               (AssertionResult *)
               "sub_message->GetReflection()->MutableUnknownFields(sub_message) != nullptr","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x333,pcVar7);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__4.message_,
             "map_sint32_sint32");
  pFVar3 = F(this,stack0xfffffffffffffe58);
  pMVar4 = Reflection::AddMessage(pRVar2,message,pFVar3,(MessageFactory *)0x0);
  pRVar5 = Message::GetReflection(pMVar4);
  pUVar6 = Reflection::MutableUnknownFields(pRVar5,pMVar4);
  local_1b9 = pUVar6 != (UnknownFieldSet *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b8,&local_1b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f0,(internal *)local_1b8,
               (AssertionResult *)
               "sub_message->GetReflection()->MutableUnknownFields(sub_message) != nullptr","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x336,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__5.message_,
             "map_sint64_sint64");
  pFVar3 = F(this,stack0xfffffffffffffe00);
  pMVar4 = Reflection::AddMessage(pRVar2,message,pFVar3,(MessageFactory *)0x0);
  pRVar5 = Message::GetReflection(pMVar4);
  pUVar6 = Reflection::MutableUnknownFields(pRVar5,pMVar4);
  local_211 = pUVar6 != (UnknownFieldSet *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_210,&local_211,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_248,(internal *)local_210,
               (AssertionResult *)
               "sub_message->GetReflection()->MutableUnknownFields(sub_message) != nullptr","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x339,pcVar7);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__6.message_,
             "map_fixed32_fixed32");
  pFVar3 = F(this,stack0xfffffffffffffda8);
  pMVar4 = Reflection::AddMessage(pRVar2,message,pFVar3,(MessageFactory *)0x0);
  pRVar5 = Message::GetReflection(pMVar4);
  pUVar6 = Reflection::MutableUnknownFields(pRVar5,pMVar4);
  local_269 = pUVar6 != (UnknownFieldSet *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_268,&local_269,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2a0,(internal *)local_268,
               (AssertionResult *)
               "sub_message->GetReflection()->MutableUnknownFields(sub_message) != nullptr","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x33c,pcVar7);
    testing::internal::AssertHelper::operator=(&local_280,&local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__7.message_,
             "map_fixed64_fixed64");
  pFVar3 = F(this,stack0xfffffffffffffd50);
  pMVar4 = Reflection::AddMessage(pRVar2,message,pFVar3,(MessageFactory *)0x0);
  pRVar5 = Message::GetReflection(pMVar4);
  pUVar6 = Reflection::MutableUnknownFields(pRVar5,pMVar4);
  local_2c1 = pUVar6 != (UnknownFieldSet *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2c0,&local_2c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f8,(internal *)local_2c0,
               (AssertionResult *)
               "sub_message->GetReflection()->MutableUnknownFields(sub_message) != nullptr","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x33f,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__8.message_,
             "map_sfixed32_sfixed32");
  pFVar3 = F(this,stack0xfffffffffffffcf8);
  pMVar4 = Reflection::AddMessage(pRVar2,message,pFVar3,(MessageFactory *)0x0);
  pRVar5 = Message::GetReflection(pMVar4);
  pUVar6 = Reflection::MutableUnknownFields(pRVar5,pMVar4);
  local_319 = pUVar6 != (UnknownFieldSet *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_318,&local_319,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_350,(internal *)local_318,
               (AssertionResult *)
               "sub_message->GetReflection()->MutableUnknownFields(sub_message) != nullptr","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x342,pcVar7);
    testing::internal::AssertHelper::operator=(&local_330,&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    std::__cxx11::string::~string((string *)&local_350);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__9.message_,
             "map_sfixed64_sfixed64");
  pFVar3 = F(this,stack0xfffffffffffffca0);
  pMVar4 = Reflection::AddMessage(pRVar2,message,pFVar3,(MessageFactory *)0x0);
  pRVar5 = Message::GetReflection(pMVar4);
  pUVar6 = Reflection::MutableUnknownFields(pRVar5,pMVar4);
  local_371 = pUVar6 != (UnknownFieldSet *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_370,&local_371,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3a8,(internal *)local_370,
               (AssertionResult *)
               "sub_message->GetReflection()->MutableUnknownFields(sub_message) != nullptr","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x345,pcVar7);
    testing::internal::AssertHelper::operator=(&local_388,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__10.message_,
             "map_int32_float");
  pFVar3 = F(this,stack0xfffffffffffffc48);
  pMVar4 = Reflection::AddMessage(pRVar2,message,pFVar3,(MessageFactory *)0x0);
  pRVar5 = Message::GetReflection(pMVar4);
  pUVar6 = Reflection::MutableUnknownFields(pRVar5,pMVar4);
  local_3c9 = pUVar6 != (UnknownFieldSet *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3c8,&local_3c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_400,(internal *)local_3c8,
               (AssertionResult *)
               "sub_message->GetReflection()->MutableUnknownFields(sub_message) != nullptr","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x348,pcVar7);
    testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    std::__cxx11::string::~string((string *)&local_400);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__11.message_,
             "map_int32_double");
  pFVar3 = F(this,stack0xfffffffffffffbf0);
  pMVar4 = Reflection::AddMessage(pRVar2,message,pFVar3,(MessageFactory *)0x0);
  pRVar5 = Message::GetReflection(pMVar4);
  pUVar6 = Reflection::MutableUnknownFields(pRVar5,pMVar4);
  local_421 = pUVar6 != (UnknownFieldSet *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_420,&local_421,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_458,(internal *)local_420,
               (AssertionResult *)
               "sub_message->GetReflection()->MutableUnknownFields(sub_message) != nullptr","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x34b,pcVar7);
    testing::internal::AssertHelper::operator=(&local_438,&local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    std::__cxx11::string::~string((string *)&local_458);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__12.message_,
             "map_bool_bool");
  pFVar3 = F(this,stack0xfffffffffffffb98);
  pMVar4 = Reflection::AddMessage(pRVar2,message,pFVar3,(MessageFactory *)0x0);
  pRVar5 = Message::GetReflection(pMVar4);
  pUVar6 = Reflection::MutableUnknownFields(pRVar5,pMVar4);
  local_479 = pUVar6 != (UnknownFieldSet *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_478,&local_479,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4b0,(internal *)local_478,
               (AssertionResult *)
               "sub_message->GetReflection()->MutableUnknownFields(sub_message) != nullptr","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x34e,pcVar7);
    testing::internal::AssertHelper::operator=(&local_490,&local_488);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    std::__cxx11::string::~string((string *)&local_4b0);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__13.message_,
             "map_string_string");
  pFVar3 = F(this,stack0xfffffffffffffb40);
  pMVar4 = Reflection::AddMessage(pRVar2,message,pFVar3,(MessageFactory *)0x0);
  pRVar5 = Message::GetReflection(pMVar4);
  pUVar6 = Reflection::MutableUnknownFields(pRVar5,pMVar4);
  local_4d1 = pUVar6 != (UnknownFieldSet *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4d0,&local_4d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
  if (!bVar1) {
    testing::Message::Message(&local_4e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_508,(internal *)local_4d0,
               (AssertionResult *)
               "sub_message->GetReflection()->MutableUnknownFields(sub_message) != nullptr","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x351,pcVar7);
    testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper(&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
    testing::Message::~Message(&local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__14.message_,
             "map_int32_bytes");
  pFVar3 = F(this,stack0xfffffffffffffae8);
  pMVar4 = Reflection::AddMessage(pRVar2,message,pFVar3,(MessageFactory *)0x0);
  pRVar5 = Message::GetReflection(pMVar4);
  pUVar6 = Reflection::MutableUnknownFields(pRVar5,pMVar4);
  local_529 = pUVar6 != (UnknownFieldSet *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_528,&local_529,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_560,(internal *)local_528,
               (AssertionResult *)
               "sub_message->GetReflection()->MutableUnknownFields(sub_message) != nullptr","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x354,pcVar7);
    testing::internal::AssertHelper::operator=(&local_540,&local_538);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    std::__cxx11::string::~string((string *)&local_560);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__15.message_,
             "map_int32_enum");
  pFVar3 = F(this,stack0xfffffffffffffa90);
  pMVar4 = Reflection::AddMessage(pRVar2,message,pFVar3,(MessageFactory *)0x0);
  pRVar5 = Message::GetReflection(pMVar4);
  pUVar6 = Reflection::MutableUnknownFields(pRVar5,pMVar4);
  local_581 = pUVar6 != (UnknownFieldSet *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_580,&local_581,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
  if (!bVar1) {
    testing::Message::Message(&local_590);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5b8,(internal *)local_580,
               (AssertionResult *)
               "sub_message->GetReflection()->MutableUnknownFields(sub_message) != nullptr","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x357,pcVar7);
    testing::internal::AssertHelper::operator=(&local_598,&local_590);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    std::__cxx11::string::~string((string *)&local_5b8);
    testing::Message::~Message(&local_590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__16.message_,
             "map_int32_foreign_message");
  pFVar3 = F(this,stack0xfffffffffffffa38);
  pMVar4 = Reflection::AddMessage(pRVar2,message,pFVar3,(MessageFactory *)0x0);
  pRVar2 = Message::GetReflection(pMVar4);
  pUVar6 = Reflection::MutableUnknownFields(pRVar2,pMVar4);
  local_5d9 = pUVar6 != (UnknownFieldSet *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5d8,&local_5d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
  if (!bVar1) {
    testing::Message::Message(&local_5e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_610,(internal *)local_5d8,
               (AssertionResult *)
               "sub_message->GetReflection()->MutableUnknownFields(sub_message) != nullptr","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x35a,pcVar7);
    testing::internal::AssertHelper::operator=(&local_5f0,&local_5e8);
    testing::internal::AssertHelper::~AssertHelper(&local_5f0);
    std::__cxx11::string::~string((string *)&local_610);
    testing::Message::~Message(&local_5e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
  return;
}

Assistant:

void MapReflectionTester::MutableUnknownFieldsOfMapFieldsViaReflection(
    Message* message) {
  const Reflection* reflection = message->GetReflection();
  Message* sub_message = nullptr;

  sub_message = reflection->AddMessage(message, F("map_int32_int32"));
  EXPECT_TRUE(sub_message->GetReflection()->MutableUnknownFields(sub_message) !=
              nullptr);
  sub_message = reflection->AddMessage(message, F("map_int64_int64"));
  EXPECT_TRUE(sub_message->GetReflection()->MutableUnknownFields(sub_message) !=
              nullptr);
  sub_message = reflection->AddMessage(message, F("map_uint32_uint32"));
  EXPECT_TRUE(sub_message->GetReflection()->MutableUnknownFields(sub_message) !=
              nullptr);
  sub_message = reflection->AddMessage(message, F("map_uint64_uint64"));
  EXPECT_TRUE(sub_message->GetReflection()->MutableUnknownFields(sub_message) !=
              nullptr);
  sub_message = reflection->AddMessage(message, F("map_sint32_sint32"));
  EXPECT_TRUE(sub_message->GetReflection()->MutableUnknownFields(sub_message) !=
              nullptr);
  sub_message = reflection->AddMessage(message, F("map_sint64_sint64"));
  EXPECT_TRUE(sub_message->GetReflection()->MutableUnknownFields(sub_message) !=
              nullptr);
  sub_message = reflection->AddMessage(message, F("map_fixed32_fixed32"));
  EXPECT_TRUE(sub_message->GetReflection()->MutableUnknownFields(sub_message) !=
              nullptr);
  sub_message = reflection->AddMessage(message, F("map_fixed64_fixed64"));
  EXPECT_TRUE(sub_message->GetReflection()->MutableUnknownFields(sub_message) !=
              nullptr);
  sub_message = reflection->AddMessage(message, F("map_sfixed32_sfixed32"));
  EXPECT_TRUE(sub_message->GetReflection()->MutableUnknownFields(sub_message) !=
              nullptr);
  sub_message = reflection->AddMessage(message, F("map_sfixed64_sfixed64"));
  EXPECT_TRUE(sub_message->GetReflection()->MutableUnknownFields(sub_message) !=
              nullptr);
  sub_message = reflection->AddMessage(message, F("map_int32_float"));
  EXPECT_TRUE(sub_message->GetReflection()->MutableUnknownFields(sub_message) !=
              nullptr);
  sub_message = reflection->AddMessage(message, F("map_int32_double"));
  EXPECT_TRUE(sub_message->GetReflection()->MutableUnknownFields(sub_message) !=
              nullptr);
  sub_message = reflection->AddMessage(message, F("map_bool_bool"));
  EXPECT_TRUE(sub_message->GetReflection()->MutableUnknownFields(sub_message) !=
              nullptr);
  sub_message = reflection->AddMessage(message, F("map_string_string"));
  EXPECT_TRUE(sub_message->GetReflection()->MutableUnknownFields(sub_message) !=
              nullptr);
  sub_message = reflection->AddMessage(message, F("map_int32_bytes"));
  EXPECT_TRUE(sub_message->GetReflection()->MutableUnknownFields(sub_message) !=
              nullptr);
  sub_message = reflection->AddMessage(message, F("map_int32_enum"));
  EXPECT_TRUE(sub_message->GetReflection()->MutableUnknownFields(sub_message) !=
              nullptr);
  sub_message = reflection->AddMessage(message, F("map_int32_foreign_message"));
  EXPECT_TRUE(sub_message->GetReflection()->MutableUnknownFields(sub_message) !=
              nullptr);
}